

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolTable.cpp
# Opt level: O0

void __thiscall Label::Label(Label *this,Identifier *name)

{
  Identifier *name_local;
  Label *this_local;
  
  Identifier::Identifier(&this->name,name);
  Identifier::Identifier(&this->originalName,name);
  this->value = 0;
  this->physicalValue = 0;
  this->physicalValueSet = false;
  this->defined = false;
  this->data = false;
  this->updateInfo = true;
  this->info = 0;
  this->section = 0;
  return;
}

Assistant:

Label::Label(const Identifier &name) :
	name(name),
	originalName(name)
{
}